

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t _elemsize;
  int i_1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  int i_3;
  int iVar7;
  int j_1;
  ulong uVar8;
  int q_2;
  ulong uVar9;
  int q;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int q_1;
  int iVar15;
  int i;
  long lVar16;
  float s;
  float fVar17;
  float m;
  float fVar18;
  int local_120;
  Mat sum;
  Mat max;
  Mat local_68;
  
  uVar2 = bottom_top_blob->dims;
  if (uVar2 == 1) {
    pvVar4 = bottom_top_blob->data;
    uVar3 = 0;
    uVar2 = bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar2 = 0;
    }
    uVar8 = (ulong)uVar2;
    fVar18 = -3.4028235e+38;
    for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      fVar17 = *(float *)((long)pvVar4 + uVar3 * 4);
      if (fVar18 <= fVar17) {
        fVar18 = fVar17;
      }
    }
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      fVar17 = expf(*(float *)((long)pvVar4 + uVar3 * 4) - fVar18);
      *(float *)((long)pvVar4 + uVar3 * 4) = fVar17;
    }
    fVar18 = 0.0;
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      fVar18 = fVar18 + *(float *)((long)pvVar4 + uVar3 * 4);
    }
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      *(float *)((long)pvVar4 + uVar3 * 4) = *(float *)((long)pvVar4 + uVar3 * 4) * (1.0 / fVar18);
    }
    return 0;
  }
  _elemsize = bottom_top_blob->elemsize;
  uVar1 = this->axis;
  if ((uVar2 ^ 2) == 0 && uVar1 == 0) {
    uVar2 = bottom_top_blob->w;
    uVar1 = bottom_top_blob->h;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.c = 0;
    max.elemsize = 0;
    max.allocator = (Allocator *)0x0;
    max.data = (void *)0x0;
    max.refcount = (int *)0x0;
    max.cstep = 0;
    Mat::create(&max,uVar2,_elemsize,opt->workspace_allocator);
    iVar15 = -100;
    if ((max.data != (void *)0x0) && ((long)max.c * max.cstep != 0)) {
      Mat::fill(&max,-3.4028235e+38);
      pvVar4 = bottom_top_blob->data;
      iVar15 = bottom_top_blob->w;
      uVar3 = 0;
      uVar8 = 0;
      if (0 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      uVar14 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar14 = uVar3;
      }
      for (; uVar3 != uVar14; uVar3 = uVar3 + 1) {
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          fVar18 = *(float *)((long)pvVar4 + uVar9 * 4);
          fVar17 = *(float *)((long)max.data + uVar9 * 4);
          if (fVar18 <= fVar17) {
            fVar18 = fVar17;
          }
          *(float *)((long)max.data + uVar9 * 4) = fVar18;
        }
        pvVar4 = (void *)((long)pvVar4 + (long)iVar15 * 4);
      }
      pvVar4 = bottom_top_blob->data;
      iVar15 = bottom_top_blob->w;
      for (uVar3 = 0; pvVar5 = max.data, uVar3 != uVar14; uVar3 = uVar3 + 1) {
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          fVar18 = expf(*(float *)((long)pvVar4 + uVar9 * 4) - *(float *)((long)pvVar5 + uVar9 * 4))
          ;
          *(float *)((long)pvVar4 + uVar9 * 4) = fVar18;
        }
        pvVar4 = (void *)((long)pvVar4 + (long)iVar15 * 4);
      }
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.c = 0;
      sum.elemsize = 0;
      sum.allocator = (Allocator *)0x0;
      sum.data = (void *)0x0;
      sum.refcount = (int *)0x0;
      sum.cstep = 0;
      Mat::create(&sum,uVar2,_elemsize,opt->workspace_allocator);
      iVar15 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        pvVar4 = bottom_top_blob->data;
        iVar15 = bottom_top_blob->w;
        for (uVar3 = 0; uVar3 != uVar14; uVar3 = uVar3 + 1) {
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)sum.data + uVar9 * 4) =
                 *(float *)((long)sum.data + uVar9 * 4) + *(float *)((long)pvVar4 + uVar9 * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + (long)iVar15 * 4);
        }
        pvVar4 = bottom_top_blob->data;
        iVar11 = bottom_top_blob->w;
        iVar15 = 0;
        for (uVar3 = 0; uVar3 != uVar14; uVar3 = uVar3 + 1) {
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar4 + uVar9 * 4) =
                 *(float *)((long)pvVar4 + uVar9 * 4) / *(float *)((long)sum.data + uVar9 * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * 4);
        }
      }
      Mat::~Mat(&sum);
    }
LAB_00117a36:
    Mat::~Mat(&max);
    return iVar15;
  }
  if ((uVar2 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
    uVar2 = bottom_top_blob->w;
    uVar1 = bottom_top_blob->h;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.c = 0;
    max.elemsize = 0;
    max.allocator = (Allocator *)0x0;
    max.data = (void *)0x0;
    max.refcount = (int *)0x0;
    max.cstep = 0;
    Mat::create(&max,uVar1,_elemsize,opt->workspace_allocator);
    pvVar4 = max.data;
    iVar15 = -100;
    if ((max.data != (void *)0x0) && ((long)max.c * max.cstep != 0)) {
      pvVar5 = bottom_top_blob->data;
      iVar15 = bottom_top_blob->w;
      uVar8 = 0;
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar8;
      }
      uVar14 = 0;
      if (0 < (int)uVar1) {
        uVar14 = (ulong)uVar1;
      }
      for (; uVar8 != uVar14; uVar8 = uVar8 + 1) {
        fVar18 = -3.4028235e+38;
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          fVar17 = *(float *)((long)pvVar5 + uVar9 * 4);
          if (fVar18 <= fVar17) {
            fVar18 = fVar17;
          }
        }
        *(float *)((long)max.data + uVar8 * 4) = fVar18;
        pvVar5 = (void *)((long)pvVar5 + (long)iVar15 * 4);
      }
      pvVar5 = bottom_top_blob->data;
      iVar15 = bottom_top_blob->w;
      for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
        fVar18 = *(float *)((long)pvVar4 + uVar8 * 4);
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          fVar17 = expf(*(float *)((long)pvVar5 + uVar9 * 4) - fVar18);
          *(float *)((long)pvVar5 + uVar9 * 4) = fVar17;
        }
        pvVar5 = (void *)((long)pvVar5 + (long)iVar15 * 4);
      }
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.c = 0;
      sum.elemsize = 0;
      sum.allocator = (Allocator *)0x0;
      sum.data = (void *)0x0;
      sum.refcount = (int *)0x0;
      sum.cstep = 0;
      Mat::create(&sum,uVar1,_elemsize,opt->workspace_allocator);
      iVar15 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        pvVar4 = bottom_top_blob->data;
        iVar15 = bottom_top_blob->w;
        for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
          fVar18 = 0.0;
          for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
            fVar18 = fVar18 + *(float *)((long)pvVar4 + uVar9 * 4);
          }
          *(float *)((long)sum.data + uVar8 * 4) = fVar18;
          pvVar4 = (void *)((long)pvVar4 + (long)iVar15 * 4);
        }
        pvVar4 = bottom_top_blob->data;
        iVar11 = bottom_top_blob->w;
        iVar15 = 0;
        for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
          fVar18 = *(float *)((long)sum.data + uVar8 * 4);
          for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar4 + uVar9 * 4) =
                 *(float *)((long)pvVar4 + uVar9 * 4) * (1.0 / fVar18);
          }
          pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * 4);
        }
      }
      Mat::~Mat(&sum);
    }
    goto LAB_00117a36;
  }
  uVar2 = uVar2 ^ 3;
  if (uVar2 == 0 && uVar1 == 0) {
    iVar15 = bottom_top_blob->w;
    iVar11 = bottom_top_blob->h;
    iVar12 = bottom_top_blob->c;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.c = 0;
    max.elemsize = 0;
    max.allocator = (Allocator *)0x0;
    max.data = (void *)0x0;
    max.refcount = (int *)0x0;
    max.cstep = 0;
    Mat::create(&max,iVar15,iVar11,_elemsize,opt->workspace_allocator);
    iVar10 = -100;
    if ((max.data != (void *)0x0) && ((long)max.c * max.cstep != 0)) {
      Mat::fill(&max,-3.4028235e+38);
      iVar10 = 0;
      uVar2 = iVar11 * iVar15;
      if (iVar11 * iVar15 < 1) {
        uVar2 = 0;
      }
      uVar3 = (ulong)uVar2;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      for (; iVar10 != iVar12; iVar10 = iVar10 + 1) {
        Mat::channel(&sum,bottom_top_blob,iVar10);
        pvVar4 = sum.data;
        Mat::~Mat(&sum);
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          fVar18 = *(float *)((long)pvVar4 + uVar8 * 4);
          fVar17 = *(float *)((long)max.data + uVar8 * 4);
          if (fVar18 <= fVar17) {
            fVar18 = fVar17;
          }
          *(float *)((long)max.data + uVar8 * 4) = fVar18;
        }
      }
      for (iVar10 = 0; iVar10 != iVar12; iVar10 = iVar10 + 1) {
        Mat::channel(&sum,bottom_top_blob,iVar10);
        pvVar4 = sum.data;
        Mat::~Mat(&sum);
        pvVar5 = max.data;
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          fVar18 = expf(*(float *)((long)pvVar4 + uVar8 * 4) - *(float *)((long)pvVar5 + uVar8 * 4))
          ;
          *(float *)((long)pvVar4 + uVar8 * 4) = fVar18;
        }
      }
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.c = 0;
      sum.elemsize = 0;
      sum.allocator = (Allocator *)0x0;
      sum.data = (void *)0x0;
      sum.refcount = (int *)0x0;
      sum.cstep = 0;
      Mat::create(&sum,iVar15,iVar11,_elemsize,opt->workspace_allocator);
      iVar10 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        for (iVar15 = 0; iVar15 != iVar12; iVar15 = iVar15 + 1) {
          Mat::channel(&local_68,bottom_top_blob,iVar15);
          pvVar4 = local_68.data;
          Mat::~Mat(&local_68);
          for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)sum.data + uVar8 * 4) =
                 *(float *)((long)sum.data + uVar8 * 4) + *(float *)((long)pvVar4 + uVar8 * 4);
          }
        }
        iVar10 = 0;
        for (iVar15 = 0; iVar15 != iVar12; iVar15 = iVar15 + 1) {
          Mat::channel(&local_68,bottom_top_blob,iVar15);
          pvVar4 = local_68.data;
          Mat::~Mat(&local_68);
          for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar4 + uVar8 * 4) =
                 *(float *)((long)pvVar4 + uVar8 * 4) / *(float *)((long)sum.data + uVar8 * 4);
          }
        }
      }
      Mat::~Mat(&sum);
    }
    Mat::~Mat(&max);
    return iVar10;
  }
  if ((uVar1 ^ 1) == 0 && uVar2 == 0) {
    uVar2 = bottom_top_blob->w;
    uVar1 = bottom_top_blob->h;
    iVar15 = bottom_top_blob->c;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.c = 0;
    max.elemsize = 0;
    max.allocator = (Allocator *)0x0;
    max.data = (void *)0x0;
    max.refcount = (int *)0x0;
    max.cstep = 0;
    Mat::create(&max,uVar1,iVar15,_elemsize,opt->workspace_allocator);
    local_120 = -100;
    if ((max.data == (void *)0x0) || ((long)max.c * max.cstep == 0)) goto LAB_00117f1b;
    Mat::fill(&max,-3.4028235e+38);
    iVar11 = 0;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    iVar12 = 0;
    if (0 < iVar15) {
      iVar12 = iVar15;
    }
    lVar16 = (long)(int)uVar2 * 4;
    for (; iVar11 != iVar12; iVar11 = iVar11 + 1) {
      Mat::channel(&sum,bottom_top_blob,iVar11);
      pvVar4 = sum.data;
      Mat::~Mat(&sum);
      for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
        fVar18 = -3.4028235e+38;
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          fVar17 = *(float *)((long)pvVar4 + uVar9 * 4);
          if (fVar18 <= fVar17) {
            fVar18 = fVar17;
          }
        }
        *(float *)((long)max.data + uVar14 * 4 + (long)iVar11 * (long)max.w * 4) = fVar18;
        pvVar4 = (void *)((long)pvVar4 + lVar16);
      }
    }
    for (iVar11 = 0; iVar11 != iVar12; iVar11 = iVar11 + 1) {
      Mat::channel(&sum,bottom_top_blob,iVar11);
      pvVar4 = sum.data;
      Mat::~Mat(&sum);
      pvVar5 = max.data;
      lVar6 = (long)max.w;
      for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
        fVar18 = *(float *)((long)pvVar5 + uVar14 * 4 + iVar11 * lVar6 * 4);
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          fVar17 = expf(*(float *)((long)pvVar4 + uVar9 * 4) - fVar18);
          *(float *)((long)pvVar4 + uVar9 * 4) = fVar17;
        }
        pvVar4 = (void *)((long)pvVar4 + lVar16);
      }
    }
    sum.dims = 0;
    sum.w = 0;
    sum.h = 0;
    sum.c = 0;
    sum.elemsize = 0;
    sum.allocator = (Allocator *)0x0;
    sum.data = (void *)0x0;
    sum.refcount = (int *)0x0;
    sum.cstep = 0;
    Mat::create(&sum,uVar1,iVar15,_elemsize,opt->workspace_allocator);
    local_120 = -100;
    if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
      Mat::fill(&sum,0.0);
      for (iVar15 = 0; iVar15 != iVar12; iVar15 = iVar15 + 1) {
        Mat::channel(&local_68,bottom_top_blob,iVar15);
        pvVar4 = local_68.data;
        Mat::~Mat(&local_68);
        for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
          fVar18 = 0.0;
          for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
            fVar18 = fVar18 + *(float *)((long)pvVar4 + uVar9 * 4);
          }
          *(float *)((long)sum.data + uVar14 * 4 + (long)iVar15 * (long)sum.w * 4) = fVar18;
          pvVar4 = (void *)((long)pvVar4 + lVar16);
        }
      }
      local_120 = 0;
      for (iVar15 = 0; iVar15 != iVar12; iVar15 = iVar15 + 1) {
        Mat::channel(&local_68,bottom_top_blob,iVar15);
        pvVar4 = local_68.data;
        Mat::~Mat(&local_68);
        for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
          fVar18 = *(float *)((long)sum.data + uVar14 * 4 + (long)iVar15 * (long)sum.w * 4);
          for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar4 + uVar9 * 4) =
                 *(float *)((long)pvVar4 + uVar9 * 4) * (1.0 / fVar18);
          }
          pvVar4 = (void *)((long)pvVar4 + lVar16);
        }
      }
    }
  }
  else {
    if (uVar2 != 0 || uVar1 != 2) {
      return 0;
    }
    uVar2 = bottom_top_blob->w;
    iVar15 = bottom_top_blob->h;
    iVar11 = bottom_top_blob->c;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.c = 0;
    max.elemsize = 0;
    max.allocator = (Allocator *)0x0;
    max.data = (void *)0x0;
    max.refcount = (int *)0x0;
    max.cstep = 0;
    Mat::create(&max,uVar2,iVar11,_elemsize,opt->workspace_allocator);
    local_120 = -100;
    if ((max.data == (void *)0x0) || ((long)max.c * max.cstep == 0)) goto LAB_00117f1b;
    Mat::fill(&max,-3.4028235e+38);
    iVar12 = 0;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    iVar10 = 0;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    lVar16 = (long)(int)uVar2 * 4;
    for (; iVar12 != iVar10; iVar12 = iVar12 + 1) {
      Mat::channel(&sum,bottom_top_blob,iVar12);
      pvVar4 = sum.data;
      Mat::~Mat(&sum);
      for (iVar7 = 0; iVar7 != iVar15; iVar7 = iVar7 + 1) {
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          fVar18 = *(float *)((long)pvVar4 + uVar8 * 4);
          fVar17 = *(float *)((long)max.data + uVar8 * 4 + (long)(max.w * iVar12) * 4);
          if (fVar18 <= fVar17) {
            fVar18 = fVar17;
          }
          *(float *)((long)max.data + uVar8 * 4 + (long)(max.w * iVar12) * 4) = fVar18;
        }
        pvVar4 = (void *)((long)pvVar4 + lVar16);
      }
    }
    for (iVar12 = 0; iVar12 != iVar10; iVar12 = iVar12 + 1) {
      Mat::channel(&sum,bottom_top_blob,iVar12);
      pvVar4 = sum.data;
      Mat::~Mat(&sum);
      pvVar5 = max.data;
      iVar7 = max.w * iVar12;
      for (iVar13 = 0; iVar13 != iVar15; iVar13 = iVar13 + 1) {
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          fVar18 = expf(*(float *)((long)pvVar4 + uVar8 * 4) -
                        *(float *)((long)pvVar5 + uVar8 * 4 + (long)iVar7 * 4));
          *(float *)((long)pvVar4 + uVar8 * 4) = fVar18;
        }
        pvVar4 = (void *)((long)pvVar4 + lVar16);
      }
    }
    sum.dims = 0;
    sum.w = 0;
    sum.h = 0;
    sum.c = 0;
    sum.elemsize = 0;
    sum.allocator = (Allocator *)0x0;
    sum.data = (void *)0x0;
    sum.refcount = (int *)0x0;
    sum.cstep = 0;
    Mat::create(&sum,uVar2,iVar11,_elemsize,opt->workspace_allocator);
    local_120 = -100;
    if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
      Mat::fill(&sum,0.0);
      for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
        Mat::channel(&local_68,bottom_top_blob,iVar11);
        pvVar4 = local_68.data;
        Mat::~Mat(&local_68);
        for (iVar12 = 0; iVar12 != iVar15; iVar12 = iVar12 + 1) {
          for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)sum.data + uVar8 * 4 + (long)(sum.w * iVar11) * 4) =
                 *(float *)((long)sum.data + uVar8 * 4 + (long)(sum.w * iVar11) * 4) +
                 *(float *)((long)pvVar4 + uVar8 * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + lVar16);
        }
      }
      local_120 = 0;
      for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
        Mat::channel(&local_68,bottom_top_blob,iVar11);
        pvVar4 = local_68.data;
        Mat::~Mat(&local_68);
        for (iVar12 = 0; iVar12 != iVar15; iVar12 = iVar12 + 1) {
          for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar4 + uVar8 * 4) =
                 *(float *)((long)pvVar4 + uVar8 * 4) /
                 *(float *)((long)sum.data + uVar8 * 4 + (long)(sum.w * iVar11) * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + lVar16);
        }
      }
    }
  }
  Mat::~Mat(&sum);
LAB_00117f1b:
  Mat::~Mat(&max);
  return local_120;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] = exp(ptr[i] - max);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - max[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            max[i] = m;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float m = max[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - m);
            }
        }

        Mat sum;
        sum.create(h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                s += ptr[j];
            }

            sum[i] = s;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = sum[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(ptr[i] - max[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(h, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                maxptr[i] = max;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = maxptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - max);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(h, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    sum += ptr[j];
                }

                sumptr[i] = sum;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = sumptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - maxptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}